

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O0

int Lodtalk::CompiledMethod::stDump(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CompiledMethod *self;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    dump((CompiledMethod *)CONCAT44(extraout_var_00,iVar1));
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x12])();
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int CompiledMethod::stDump(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);
    self->dump();
    return interpreter->returnReceiver();
}